

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

VNode * despot::DESPOT::Prune(VNode *vnode,ACT_TYPE *pruned_action,double *pruned_value)

{
  pointer ppQVar1;
  QNode *qnode;
  int iVar2;
  VNode *pVVar3;
  OBS_TYPE edge;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar4;
  QNode *this;
  QNode *this_00;
  int i;
  ulong uVar5;
  double dVar6;
  ValuedAction VVar7;
  double local_88;
  QNode *qstar;
  int *local_70;
  double *local_68;
  VNode *local_60;
  double local_58;
  double nu;
  vector<despot::State_*,_std::allocator<despot::State_*>_> empty;
  
  empty.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar3 = (VNode *)operator_new(0x98);
  iVar2 = VNode::depth(vnode);
  edge = VNode::edge(vnode);
  VNode::VNode(pVVar3,&empty,iVar2,(QNode *)0x0,edge);
  local_70 = pruned_action;
  local_68 = pruned_value;
  local_60 = pVVar3;
  pvVar4 = VNode::children(vnode);
  local_88 = -INFINITY;
  qstar = (QNode *)0x0;
  iVar2 = -1;
  this_00 = (QNode *)0x0;
  uVar5 = 0;
  while( true ) {
    ppQVar1 = (pvVar4->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar4->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar1 >> 3) <= uVar5)
    break;
    qnode = ppQVar1[uVar5];
    this = Prune(qnode,&nu);
    local_58 = nu;
    if (nu <= local_88) {
      QNode::~QNode(this);
      operator_delete(this,0x88);
    }
    else {
      iVar2 = QNode::edge(qnode);
      if (this_00 != (QNode *)0x0) {
        QNode::~QNode(this_00);
        operator_delete(this_00,0x88);
      }
      local_88 = local_58;
      this_00 = this;
      qstar = this;
    }
    uVar5 = uVar5 + 1;
  }
  VVar7 = VNode::default_move(vnode);
  pVVar3 = local_60;
  if (VVar7.value <= local_88) {
    pvVar4 = VNode::children(local_60);
    std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::push_back(pvVar4,&qstar);
    QNode::parent(qstar,pVVar3);
  }
  else {
    VVar7 = VNode::default_move(vnode);
    local_88 = VVar7.value;
    VVar7 = VNode::default_move(vnode);
    iVar2 = VVar7.action;
    if (this_00 != (QNode *)0x0) {
      QNode::~QNode(this_00);
    }
    operator_delete(this_00,0x88);
  }
  dVar6 = VNode::lower_bound(vnode);
  VNode::lower_bound(pVVar3,dVar6);
  dVar6 = VNode::upper_bound(vnode);
  VNode::upper_bound(pVVar3,dVar6);
  *local_70 = iVar2;
  *local_68 = local_88;
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&empty.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return pVVar3;
}

Assistant:

VNode* DESPOT::Prune(VNode* vnode, ACT_TYPE& pruned_action, double& pruned_value) {
	vector<State*> empty;
	VNode* pruned_v = new VNode(empty, vnode->depth(), NULL,
		vnode->edge());

	vector<QNode*>& children = vnode->children();
	ACT_TYPE astar = -1;
	double nustar = Globals::NEG_INFTY;
	QNode* qstar = NULL;
	for (int i = 0; i < children.size(); i++) {
		QNode* qnode = children[i];
		double nu;
		QNode* pruned_q = Prune(qnode, nu);

		if (nu > nustar) {
			nustar = nu;
			astar = qnode->edge();

			if (qstar != NULL) {
				delete qstar;
			}

			qstar = pruned_q;
		} else {
			delete pruned_q;
		}
	}

	if (nustar < vnode->default_move().value) {
		nustar = vnode->default_move().value;
		astar = vnode->default_move().action;
		delete qstar;
	} else {
		pruned_v->children().push_back(qstar);
		qstar->parent(pruned_v);
	}

	pruned_v->lower_bound(vnode->lower_bound()); // for debugging
	pruned_v->upper_bound(vnode->upper_bound());

	pruned_action = astar;
	pruned_value = nustar;

	return pruned_v;
}